

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_scratch_space * secp256k1_scratch_space_create(secp256k1_context *ctx,size_t max_size)

{
  secp256k1_scratch_space *psVar1;
  
  psVar1 = (secp256k1_scratch_space *)checked_malloc(&ctx->error_callback,0x90);
  if (psVar1 != (secp256k1_scratch_space *)0x0) {
    psVar1->frame_size[4] = 0;
    psVar1->frame = 0;
    psVar1->frame_size[2] = 0;
    psVar1->frame_size[3] = 0;
    psVar1->frame_size[0] = 0;
    psVar1->frame_size[1] = 0;
    psVar1->offset[3] = 0;
    psVar1->offset[4] = 0;
    psVar1->offset[1] = 0;
    psVar1->offset[2] = 0;
    psVar1->data[4] = (void *)0x0;
    psVar1->offset[0] = 0;
    psVar1->data[2] = (void *)0x0;
    psVar1->data[3] = (void *)0x0;
    psVar1->data[0] = (void *)0x0;
    psVar1->data[1] = (void *)0x0;
    psVar1->max_size = max_size;
    psVar1->error_callback = &ctx->error_callback;
  }
  return psVar1;
}

Assistant:

secp256k1_scratch_space* secp256k1_scratch_space_create(const secp256k1_context* ctx, size_t max_size) {
    VERIFY_CHECK(ctx != NULL);
    return secp256k1_scratch_create(&ctx->error_callback, max_size);
}